

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcStructuralConnection::~IfcStructuralConnection
          (IfcStructuralConnection *this)

{
  *(undefined8 *)&this[-1].field_0x38 = 0x906c88;
  *(undefined8 *)&this->field_0x20 = 0x906d00;
  *(undefined8 *)&this[-1].field_0xc0 = 0x906cb0;
  *(undefined8 *)&this[-1].field_0xd0 = 0x906cd8;
  if (*(undefined1 **)&this[-1].field_0xe0 != &this[-1].field_0xf0) {
    operator_delete(*(undefined1 **)&this[-1].field_0xe0,*(long *)&this[-1].field_0xf0 + 1);
  }
  *(undefined8 *)&this[-1].field_0x38 = 0x906da0;
  *(undefined8 *)&this->field_0x20 = 0x906dc8;
  if (*(undefined1 **)&this[-1].field_0x98 != &this[-1].field_0xa8) {
    operator_delete(*(undefined1 **)&this[-1].field_0x98,*(long *)&this[-1].field_0xa8 + 1);
  }
  if (*(undefined1 **)&this[-1].field_0x70 != &this[-1].field_0x80) {
    operator_delete(*(undefined1 **)&this[-1].field_0x70,*(long *)&this[-1].field_0x80 + 1);
  }
  if (*(undefined1 **)&this[-1].field_0x48 != &this[-1].field_0x58) {
    operator_delete(*(undefined1 **)&this[-1].field_0x48,*(long *)&this[-1].field_0x58 + 1);
    return;
  }
  return;
}

Assistant:

IfcStructuralConnection() : Object("IfcStructuralConnection") {}